

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O1

intmax_t config_find_number_fallback(map *config_map,char *key,intmax_t fallback)

{
  map_entry *pmVar1;
  int *piVar2;
  
  pmVar1 = map_get(config_map,key);
  if (pmVar1 == (map_entry *)0x0) {
    piVar2 = (int *)0x0;
  }
  else {
    piVar2 = (int *)pmVar1->value;
  }
  if ((piVar2 != (int *)0x0) && (*piVar2 == 2)) {
    fallback = *(intmax_t *)(piVar2 + 2);
  }
  return fallback;
}

Assistant:

intmax_t config_find_number_fallback(const struct map *config_map, const char *key,
                                     intmax_t fallback)
{
        intmax_t value = 0;

        if (config_find_number(config_map, key, &value) != NO_ERROR) {
                return fallback;
        }

        return value;
}